

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c6280_mame.c
# Opt level: O0

void * device_start_c6280mame(UINT32 clock,UINT32 rate)

{
  double dVar1;
  double local_38;
  double level;
  double step;
  int i;
  c6280_t *info;
  UINT32 rate_local;
  UINT32 clock_local;
  
  local_38 = 341.3333333333333;
  _rate_local = (c6280_t *)calloc(1,0x4290);
  if (_rate_local == (c6280_t *)0x0) {
    _rate_local = (c6280_t *)0x0;
  }
  else {
    c6280_calculate_clocks(_rate_local,(double)clock,(double)rate);
    for (step._4_4_ = 0; step._4_4_ < 0x1f; step._4_4_ = step._4_4_ + 1) {
      _rate_local->volume_table[step._4_4_] = (INT16)(int)local_38;
      dVar1 = pow(10.0,0.075);
      local_38 = local_38 / dVar1;
    }
    _rate_local->volume_table[0x1f] = 0;
    c6280mame_set_mute_mask(_rate_local,0);
  }
  return _rate_local;
}

Assistant:

static void* device_start_c6280mame(UINT32 clock, UINT32 rate)
{
	c6280_t *info;
	int i;
	double step;
	/* Loudest volume level for table */
	double level = 65536.0 / 6.0 / 32.0;

	info = (c6280_t*)calloc(1, sizeof(c6280_t));
	if (info == NULL)
		return NULL;

	c6280_calculate_clocks(info, clock, rate);

	/* Make volume table */
	/* PSG has 48dB volume range spread over 32 steps */
	step = 48.0 / 32.0;
	for (i = 0; i < 31; i++)
	{
		info->volume_table[i] = (UINT16)level;
		level /= pow(10.0, step / 20.0);
	}
	info->volume_table[31] = 0;

	c6280mame_set_mute_mask(info, 0x00);

	return info;
}